

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDLImporter *this,IntBone_MDL7 **apcOutBones)

{
  uchar *puVar1;
  IntBone_MDL7 *pIVar2;
  IntBone_MDL7 *pIVar3;
  ai_uint32 aVar4;
  ushort *puVar5;
  uint local_58;
  uint local_54;
  uint32_t qq;
  uint32_t iMaxLen;
  IntBone_MDL7 *pcParentBone;
  IntBone_MDL7 *pcOutBone;
  Bone_MDL7 *pcBone;
  uint local_30;
  uint32_t iBone;
  uint32_t iIterations;
  uint16_t iParent;
  Bone_MDL7 *pcBones;
  Header_MDL7 *pcHeader;
  IntBone_MDL7 **apcOutBones_local;
  MDLImporter *this_local;
  
  puVar1 = this->mBuffer;
  if (apcOutBones == (IntBone_MDL7 **)0x0) {
    __assert_fail("__null != apcOutBones",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/MDL/MDLLoader.cpp"
                  ,0x379,
                  "void Assimp::MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDL::IntBone_MDL7 **)");
  }
  iBone._2_2_ = 0xffff;
  local_30 = 0;
  do {
    if (*(uint *)(puVar1 + 8) <= local_30) {
      return;
    }
    for (pcBone._4_4_ = 0; pcBone._4_4_ < *(uint *)(puVar1 + 8); pcBone._4_4_ = pcBone._4_4_ + 1) {
      puVar5 = (ushort *)(puVar1 + (ulong)(pcBone._4_4_ * *(ushort *)(puVar1 + 0x1c)) + 0x30);
      if (iBone._2_2_ == *puVar5) {
        pIVar2 = apcOutBones[pcBone._4_4_];
        pIVar2->iParent = (ulong)*puVar5;
        if (iBone._2_2_ != 0xffff) {
          pIVar3 = apcOutBones[iBone._2_2_];
          (pIVar2->super_aiBone).mOffsetMatrix.a4 = -(pIVar3->vPosition).x;
          (pIVar2->super_aiBone).mOffsetMatrix.b4 = -(pIVar3->vPosition).y;
          (pIVar2->super_aiBone).mOffsetMatrix.c4 = -(pIVar3->vPosition).z;
        }
        (pIVar2->vPosition).x = *(float *)(puVar5 + 2);
        (pIVar2->vPosition).y = *(float *)(puVar5 + 4);
        (pIVar2->vPosition).z = *(float *)(puVar5 + 6);
        (pIVar2->super_aiBone).mOffsetMatrix.a4 =
             (pIVar2->super_aiBone).mOffsetMatrix.a4 - *(float *)(puVar5 + 2);
        (pIVar2->super_aiBone).mOffsetMatrix.b4 =
             (pIVar2->super_aiBone).mOffsetMatrix.b4 - *(float *)(puVar5 + 4);
        (pIVar2->super_aiBone).mOffsetMatrix.c4 =
             (pIVar2->super_aiBone).mOffsetMatrix.c4 - *(float *)(puVar5 + 6);
        if (*(short *)(puVar1 + 0x1c) == 0x10) {
          aVar4 = snprintf((pIVar2->super_aiBone).mName.data,0x400,"UnnamedBone_%i",
                           (ulong)pcBone._4_4_);
          (pIVar2->super_aiBone).mName.length = aVar4;
        }
        else {
          local_54 = *(ushort *)(puVar1 + 0x1c) - 0x10;
          for (local_58 = 0; local_58 < local_54; local_58 = local_58 + 1) {
            if (*(char *)((long)puVar5 + (ulong)local_58 + 0x10) == '\0') {
              local_54 = local_58;
              break;
            }
          }
          (pIVar2->super_aiBone).mName.length = local_54;
          memcpy((pIVar2->super_aiBone).mName.data,puVar5 + 8,
                 (ulong)(pIVar2->super_aiBone).mName.length);
          (pIVar2->super_aiBone).mName.data[(pIVar2->super_aiBone).mName.length] = '\0';
        }
      }
    }
    iBone._2_2_ = iBone._2_2_ + 1;
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void MDLImporter::CalcAbsBoneMatrices_3DGS_MDL7(MDL::IntBone_MDL7** apcOutBones)
{
    const MDL::Header_MDL7 *pcHeader = (const MDL::Header_MDL7*)this->mBuffer;
    const MDL::Bone_MDL7* pcBones = (const MDL::Bone_MDL7*)(pcHeader+1);
    ai_assert(NULL != apcOutBones);

    // first find the bone that has NO parent, calculate the
    // animation matrix for it, then go on and search for the next parent
    // index (0) and so on until we can't find a new node.
    uint16_t iParent = 0xffff;
    uint32_t iIterations = 0;
    while (iIterations++ < pcHeader->bones_num) {
        for (uint32_t iBone = 0; iBone < pcHeader->bones_num;++iBone)   {
            BE_NCONST MDL::Bone_MDL7* pcBone = _AI_MDL7_ACCESS_PTR(pcBones,iBone,
                pcHeader->bone_stc_size,MDL::Bone_MDL7);

            AI_SWAP2(pcBone->parent_index);
            AI_SWAP4(pcBone->x);
            AI_SWAP4(pcBone->y);
            AI_SWAP4(pcBone->z);

            if (iParent == pcBone->parent_index)    {
                // MDL7 readme
                ////////////////////////////////////////////////////////////////
                /*
                The animation matrix is then calculated the following way:

                vector3 bPos = <absolute bone position>
                matrix44 laM;   // local animation matrix
                sphrvector key_rotate = <bone rotation>

                matrix44 m1,m2;
                create_trans_matrix(m1, -bPos.x, -bPos.y, -bPos.z);
                create_trans_matrix(m2, -bPos.x, -bPos.y, -bPos.z);

                create_rotation_matrix(laM,key_rotate);

                laM = sm1 * laM;
                laM = laM * sm2;
                */
                /////////////////////////////////////////////////////////////////

                MDL::IntBone_MDL7* const pcOutBone = apcOutBones[iBone];

                // store the parent index of the bone
                pcOutBone->iParent = pcBone->parent_index;
                if (0xffff != iParent)  {
                    const MDL::IntBone_MDL7* pcParentBone = apcOutBones[iParent];
                    pcOutBone->mOffsetMatrix.a4 = -pcParentBone->vPosition.x;
                    pcOutBone->mOffsetMatrix.b4 = -pcParentBone->vPosition.y;
                    pcOutBone->mOffsetMatrix.c4 = -pcParentBone->vPosition.z;
                }
                pcOutBone->vPosition.x = pcBone->x;
                pcOutBone->vPosition.y = pcBone->y;
                pcOutBone->vPosition.z = pcBone->z;
                pcOutBone->mOffsetMatrix.a4 -= pcBone->x;
                pcOutBone->mOffsetMatrix.b4 -= pcBone->y;
                pcOutBone->mOffsetMatrix.c4 -= pcBone->z;

                if (AI_MDL7_BONE_STRUCT_SIZE__NAME_IS_NOT_THERE == pcHeader->bone_stc_size) {
                    // no real name for our poor bone is specified :-(
                    pcOutBone->mName.length = ai_snprintf(pcOutBone->mName.data, MAXLEN,
                        "UnnamedBone_%i",iBone);
                }
                else    {
                    // Make sure we won't run over the buffer's end if there is no
                    // terminal 0 character (however the documentation says there
                    // should be one)
                    uint32_t iMaxLen = pcHeader->bone_stc_size-16;
                    for (uint32_t qq = 0; qq < iMaxLen;++qq)    {
                        if (!pcBone->name[qq])  {
                            iMaxLen = qq;
                            break;
                        }
                    }

                    // store the name of the bone
                    pcOutBone->mName.length = (size_t)iMaxLen;
                    ::memcpy(pcOutBone->mName.data,pcBone->name,pcOutBone->mName.length);
                    pcOutBone->mName.data[pcOutBone->mName.length] = '\0';
                }
            }
        }
        ++iParent;
    }
}